

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<kj::Rc<kj::Refcounted>_> __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::completeThirdParty
          (ConnectionImpl *this,Reader completion)

{
  TestVat *this_00;
  uint64_t token;
  long in_RSI;
  ThirdPartyExchange *xchg;
  ConnectionImpl *this_local;
  
  this_00 = *(TestVat **)(in_RSI + 0x20);
  token = capnproto_test::capnp::test::TestThirdPartyCompletion::Reader::getToken(&completion);
  getTphExchange(this_00,token);
  kj::ForkedPromise<kj::Rc<kj::Refcounted>_>::addBranch
            ((ForkedPromise<kj::Rc<kj::Refcounted>_> *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Rc<kj::Refcounted>> completeThirdParty(
        test::TestThirdPartyCompletion::Reader completion) override {
      auto& xchg = vat.getTphExchange(completion.getToken());
      return xchg.promise.addBranch();
    }